

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O2

void h_scroll_do_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  int iVar2;
  Am_Value *pAVar3;
  float fVar4;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object_Method proc;
  
  proc.from_wrapper = (Am_Method_Wrapper *)0x0;
  proc.Call = (Am_Object_Method_Type *)0x0;
  Am_Object::Get_Object((ushort)&local_30,(ulong)&Am_Scrolling_Group);
  Am_Object::Get_Object((ushort)&local_40,(ulong)&local_30);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_40,0xca);
  Am_Object_Method::operator=(&proc,pAVar3);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_30);
  pAVar1 = proc.Call;
  Am_Object::Am_Object(&local_38,cmd);
  (*pAVar1)((Am_Object_Data *)&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  fVar4 = get_long_short_ratio_x();
  Am_Object::Set(0xe428,100,(ulong)(uint)(int)((float)iVar2 * fVar4));
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, h_scroll_do, (Am_Object cmd))
{
  //first, call the standard method
  Am_Object_Method proc;
  proc = Am_Scrolling_Group.Get_Object(Am_H_SCROLLER)
             .Get_Object(Am_COMMAND)
             .Get(Am_DO_METHOD);
  proc.Call(cmd);
  //update the long range scroller
  int val = cmd.Get(Am_VALUE);
  float ratio_x = get_long_short_ratio_x();
  SP_Long_Feed.Set(Am_LEFT, (int)(val * ratio_x));
}